

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::NoteNewRevision(cmCTestP4 *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  GetWorkingRevision_abi_cxx11_((string *)local_188,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).NewRevision,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"   New revision of repository is: ",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,
                      (this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p,
                      (this->super_cmCTestGlobalVC).NewRevision._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x182,(char *)local_1a8,false);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool cmCTestP4::NoteNewRevision()
{
  this->NewRevision = this->GetWorkingRevision();

  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   New revision of repository is: " << this->NewRevision
                                                  << "\n");
  return true;
}